

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O2

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _w;
  uint _h;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int _c;
  ulong uVar13;
  size_t sVar14;
  int k;
  long lVar15;
  int k_1;
  Mat out;
  Mat m;
  
  iVar1 = bottom_blob->elempack;
  uVar9 = (ulong)iVar1;
  iVar7 = this->out_elempack;
  uVar13 = (ulong)iVar7;
  if (iVar1 != iVar7) {
    _w = bottom_blob->w;
    lVar4 = (long)(int)_w;
    _h = bottom_blob->h;
    iVar11 = bottom_blob->c;
    iVar12 = bottom_blob->dims;
    uVar2 = bottom_blob->elemsize;
    if (this->use_padding != 0) {
      if (iVar12 == 1) {
LAB_00158612:
        if (iVar7 == 1) {
          Mat::operator=(top_blob,bottom_blob);
          top_blob->w = iVar1 * _w;
          top_blob->cstep = (long)(int)(iVar1 * _w);
          top_blob->elemsize = uVar2 / uVar9;
          top_blob->elempack = this->out_elempack;
          return 0;
        }
        Mat::create(top_blob,(int)(iVar1 * _w + iVar7 + -1) / iVar7,uVar13 * (uVar2 / uVar9),iVar7,
                    opt->blob_allocator);
        if (top_blob->data != (void *)0x0) {
          if ((long)top_blob->c * top_blob->cstep != 0) {
            memcpy(top_blob->data,bottom_blob->data,uVar2 * lVar4);
            return 0;
          }
          return -100;
        }
        return -100;
      }
      if (iVar12 != 3) {
        if (iVar12 != 2) {
          return 0;
        }
LAB_00158478:
        uVar10 = (long)(int)(iVar7 + _h * iVar1 + -1) / (long)iVar7;
        uVar6 = uVar10 & 0xffffffff;
        sVar14 = (uVar2 / uVar9) * uVar13;
        uVar13 = sVar14 / uVar13;
        iVar11 = (int)uVar10;
        Mat::create(top_blob,_w,iVar11,sVar14,iVar7,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar9 = 0;
        if (0 < (int)_w) {
          uVar9 = (ulong)_w;
        }
        if (iVar11 < 1) {
          uVar6 = 0;
        }
        uVar10 = 0;
        do {
          if (uVar10 == uVar6) {
            return 0;
          }
          pvVar3 = top_blob->data;
          for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            for (lVar15 = 0; lVar15 < this->out_elempack; lVar15 = lVar15 + 1) {
              iVar7 = this->out_elempack * (int)uVar10 + (int)lVar15;
              iVar11 = iVar7 / iVar1;
              if ((int)_h <= iVar11) break;
              memcpy((void *)((long)pvVar3 +
                             uVar13 * lVar15 + sVar14 * uVar5 + uVar10 * sVar14 * lVar4),
                     (void *)((long)bottom_blob->data +
                             (long)(iVar7 % iVar1) * uVar13 + uVar2 * uVar5 +
                             (long)(int)(iVar11 * _w) * uVar2),uVar13);
            }
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
LAB_00158660:
      iVar12 = (iVar7 + iVar11 * iVar1 + -1) / iVar7;
      sVar14 = (uVar2 / uVar9) * uVar13;
      uVar13 = sVar14 / uVar13;
      Mat::create(top_blob,_w,_h,iVar12,sVar14,iVar7,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      uVar9 = 0;
      if (0 < (int)_w) {
        uVar9 = (ulong)_w;
      }
      uVar10 = (ulong)_h;
      if ((int)_h < 1) {
        uVar10 = 0;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar7 = 0;
      do {
        if (iVar7 == iVar12) {
          return 0;
        }
        Mat::channel(&out,top_blob,iVar7);
        for (uVar6 = 0; pvVar3 = out.data, uVar6 != uVar10; uVar6 = uVar6 + 1) {
          for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            for (lVar15 = 0; lVar15 < this->out_elempack; lVar15 = lVar15 + 1) {
              iVar8 = this->out_elempack * iVar7 + (int)lVar15;
              _c = iVar8 / iVar1;
              if (iVar11 <= _c) break;
              Mat::channel(&m,bottom_blob,_c);
              memcpy((void *)((long)pvVar3 +
                             uVar13 * lVar15 + sVar14 * uVar5 + sVar14 * uVar6 * lVar4),
                     (void *)((long)m.data +
                             (long)(iVar8 % iVar1) * uVar13 + uVar2 * uVar5 + uVar6 * lVar4 * uVar2)
                     ,uVar13);
              Mat::~Mat(&m);
            }
          }
        }
        Mat::~Mat(&out);
        iVar7 = iVar7 + 1;
      } while( true );
    }
    if (iVar12 == 3) {
      if ((iVar11 * iVar1) % iVar7 == 0) goto LAB_00158660;
    }
    else if (iVar12 == 2) {
      if ((int)(_h * iVar1) % iVar7 == 0) goto LAB_00158478;
    }
    else {
      if (iVar12 != 1) {
        return 0;
      }
      if ((int)(_w * iVar1) % iVar7 == 0) goto LAB_00158612;
    }
  }
  Mat::operator=(top_blob,bottom_blob);
  return 0;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 3 && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}